

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diplodocus.cpp
# Opt level: O0

void getStats(void)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  reference ppVar4;
  reference ppVar5;
  size_type sVar6;
  reference ppVar7;
  size_type sVar8;
  undefined1 local_738 [8];
  pair<const_unsigned_long,_Molecule> i_2;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
  *__range1_2;
  ostream local_6e0 [8];
  ofstream Moleculesstats;
  undefined1 local_4e0 [8];
  pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  i_1;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *__range1_1;
  ostream local_468 [8];
  ofstream ProvIdxstats;
  pair<const_unsigned_long,_int> i;
  _Node_iterator_base<std::pair<const_unsigned_long,_int>,_false> local_250;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  ostream local_208 [8];
  ofstream contextTriplesstats;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"writing stats");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator+(&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 diplo::statsDir_abi_cxx11_,"contextTriples.stats");
  std::ofstream::ofstream(local_208,(string *)&local_228,_S_out);
  std::__cxx11::string::~string((string *)&local_228);
  __end1 = std::
           unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
           ::begin((unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                    *)diplo::contextTriples);
  local_250._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
       ::end((unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
              *)diplo::contextTriples);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<std::pair<const_unsigned_long,_int>,_false>
                       ,&local_250);
    if (!bVar2) break;
    ppVar4 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_int>,_false,_false>::
             operator*(&__end1);
    uVar1 = *(undefined8 *)&ppVar4->second;
    poVar3 = (ostream *)std::ostream::operator<<(local_208,ppVar4->first);
    poVar3 = std::operator<<(poVar3,"\t");
    i.first._0_4_ = (int)uVar1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)i.first);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__detail::_Node_iterator<std::pair<const_unsigned_long,_int>,_false,_false>::operator++
              (&__end1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 diplo::statsDir_abi_cxx11_,"ProvIdx.stats");
  std::ofstream::ofstream(local_468,(string *)&__range1_1,_S_out);
  std::__cxx11::string::~string((string *)&__range1_1);
  __end1_1 = std::
             unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
             ::begin((unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                      *)diplo::ProvIdx);
  i_1.second._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
       ::end((unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
              *)diplo::ProvIdx);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1_1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                         *)&i_1.second._M_h._M_single_bucket);
    if (!bVar2) break;
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_false>
             ::operator*(&__end1_1);
    std::
    pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
    ::pair((pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
            *)local_4e0,ppVar5);
    poVar3 = (ostream *)std::ostream::operator<<(local_468,(ulong)local_4e0);
    poVar3 = std::operator<<(poVar3,"\t");
    sVar6 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&i_1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar6);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::
    pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
    ::~pair((pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
             *)local_4e0);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_false>
    ::operator++(&__end1_1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 diplo::statsDir_abi_cxx11_,"Molecules.stats");
  std::ofstream::ofstream(local_6e0,(string *)&__range1_2,_S_out);
  std::__cxx11::string::~string((string *)&__range1_2);
  __end1_2 = std::
             unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
             ::begin((unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
                      *)(diplo::M + 0x30));
  i_2.second.next.
  super__Vector_base<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
                ::end((unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
                       *)(diplo::M + 0x30));
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1_2.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false>,
                       (_Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false> *)
                       &i_2.second.next.
                        super__Vector_base<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) break;
    ppVar7 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false>::
             operator*(&__end1_2);
    std::pair<const_unsigned_long,_Molecule>::pair
              ((pair<const_unsigned_long,_Molecule> *)local_738,ppVar7);
    poVar3 = (ostream *)std::ostream::operator<<(local_6e0,(ulong)local_738);
    poVar3 = std::operator<<(poVar3,"\t");
    sVar8 = std::
            vector<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>_>_>
            ::size((vector<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>_>_>
                    *)&i_2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::pair<const_unsigned_long,_Molecule>::~pair
              ((pair<const_unsigned_long,_Molecule> *)local_738);
    std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false>::
    operator++(&__end1_2);
  }
  std::ofstream::~ofstream(local_6e0);
  std::ofstream::~ofstream(local_468);
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void getStats() {
    cout << "writing stats" << endl;
    ofstream contextTriplesstats(statsDir+"contextTriples.stats");
    for (auto i : contextTriples) {
        contextTriplesstats << i.first << "\t" << i.second << endl;
    }

    ofstream ProvIdxstats(statsDir+"ProvIdx.stats");
    for (auto i : ProvIdx) {
        ProvIdxstats << i.first << "\t" << i.second.size() << endl;
    }

    ofstream Moleculesstats(statsDir+"Molecules.stats");
    for (auto i : M.molecules) {
        Moleculesstats << i.first << "\t" << i.second.next.size() << endl;
    }
}